

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericCommand.cpp
# Opt level: O2

void __thiscall Jupiter::GenericCommand::~GenericCommand(GenericCommand *this)

{
  pointer ppPVar1;
  Plugin **plugin;
  pointer ppPVar2;
  
  (this->super_Command)._vptr_Command = (_func_int **)&PTR___cxa_pure_virtual_0015a1f0;
  ppPVar2 = g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar1 = g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (this->m_parent != (GenericCommandNamespace *)0x0) {
    GenericCommandNamespace::removeCommand(this->m_parent,this);
    ppPVar2 = g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppPVar1 = g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  for (; ppPVar2 != ppPVar1; ppPVar2 = ppPVar2 + 1) {
    (*((*ppPVar2)->super_Thinker)._vptr_Thinker[0x1b])(*ppPVar2,this);
  }
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<Jupiter::GenericCommand>)._M_weak_this.
              super___weak_ptr<Jupiter::GenericCommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Command::~Command(&this->super_Command);
  return;
}

Assistant:

Jupiter::GenericCommand::~GenericCommand() {
	// Inform the parent
	if (GenericCommand::m_parent != nullptr) {
		GenericCommand::m_parent->removeCommand(*this);
	}

	// Notify plugins
	for (auto& plugin : Jupiter::plugins) {
		plugin->OnGenericCommandRemove(*this);
	}
}